

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

opj_bool opj_decode_tile_data
                   (opj_codec_t *p_codec,OPJ_UINT32 p_tile_index,OPJ_BYTE *p_data,
                   OPJ_UINT32 p_data_size,opj_stream_t *p_stream)

{
  opj_bool oVar1;
  
  if ((p_stream != (opj_stream_t *)0x0 &&
       (p_data != (OPJ_BYTE *)0x0 && p_codec != (opj_codec_t *)0x0)) &&
     (*(int *)(p_codec + 0xc) != 0)) {
    oVar1 = (*(code *)p_codec[3])(p_codec[10]);
    return oVar1;
  }
  return 0;
}

Assistant:

opj_bool OPJ_CALLCONV opj_decode_tile_data(
					opj_codec_t *p_codec,
					OPJ_UINT32 p_tile_index,
					OPJ_BYTE * p_data,
					OPJ_UINT32 p_data_size,
					opj_stream_t *p_stream
					)
{
	if (p_codec && p_data && p_stream) {
		opj_codec_private_t * l_info = (opj_codec_private_t *) p_codec;
		opj_stream_private_t * l_cio = (opj_stream_private_t *) p_stream;

		if (! l_info->is_decompressor) {
			return OPJ_FALSE;
		}

		return l_info->m_codec_data.m_decompression.opj_decode_tile_data(	l_info->m_codec,
																			p_tile_index,
																			p_data,
																			p_data_size,
																			l_cio,
																			l_info->m_event_mgr);
	}
	return OPJ_FALSE;
}